

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_bang.c
# Opt level: O0

void bng_draw_select(t_bng *x,_glist *glist)

{
  _glist *p_Var1;
  char local_a8 [8];
  char tag [128];
  int lcol;
  int col;
  _glist *canvas;
  _glist *glist_local;
  t_bng *x_local;
  
  p_Var1 = glist_getcanvas(glist);
  tag[0x7c] = '\0';
  tag[0x7d] = '\0';
  tag[0x7e] = '\0';
  tag[0x7f] = '\0';
  tag._120_4_ = (x->x_gui).x_lcol;
  if (((uint)(x->x_gui).x_fsf >> 0x18 & 1) != 0) {
    tag[0x78] = -1;
    tag[0x79] = '\0';
    tag[0x7a] = '\0';
    tag[0x7b] = '\0';
    tag[0x7c] = -1;
    tag[0x7d] = '\0';
    tag[0x7e] = '\0';
    tag[0x7f] = '\0';
  }
  sprintf(local_a8,"%lxBASE",x);
  pdgui_vmess((char *)0x0,"crs rk",p_Var1,"itemconfigure",local_a8,"-outline",tag._124_4_);
  sprintf(local_a8,"%lxBUT",x);
  pdgui_vmess((char *)0x0,"crs rk",p_Var1,"itemconfigure",local_a8,"-outline",tag._124_4_);
  sprintf(local_a8,"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crs rk",p_Var1,"itemconfigure",local_a8,"-fill",tag._120_4_);
  return;
}

Assistant:

static void bng_draw_select(t_bng* x, t_glist* glist)
{
    t_canvas *canvas = glist_getcanvas(glist);
    int col = IEM_GUI_COLOR_NORMAL, lcol = x->x_gui.x_lcol;
    char tag[128];

    if(x->x_gui.x_fsf.x_selected)
        col = lcol = IEM_GUI_COLOR_SELECTED;

    sprintf(tag, "%lxBASE", x);
    pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag, "-outline", col);
    sprintf(tag, "%lxBUT", x);
    pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag, "-outline", col);
    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag, "-fill", lcol);
}